

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableBeginCell(ImGuiTable *table,int column_n)

{
  float fVar1;
  bool bVar2;
  ImGuiWindow *window;
  ImGuiContext *pIVar3;
  ImGuiTableColumn *pIVar4;
  ImDrawList *draw_list;
  ImDrawListSplitter *this;
  uint uVar5;
  float fVar6;
  float fVar7;
  
  pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  window = table->InnerWindow;
  table->CurrentColumn = column_n;
  fVar1 = pIVar4->WorkMinX;
  fVar7 = fVar1;
  if ((pIVar4->Flags & 0x10000) != 0) {
    fVar7 = table->RowIndentOffsetX + fVar1;
  }
  (window->DC).CursorPos.x = fVar7;
  fVar6 = table->RowPosY1 + table->CellPaddingY;
  (window->DC).CursorPos.y = fVar6;
  (window->DC).CursorMaxPos.x = fVar7;
  (window->DC).ColumnsOffset.x = (fVar7 - (window->Pos).x) - (window->DC).Indent.x;
  (window->DC).CurrLineTextBaseOffset = table->RowTextBaseline;
  (window->DC).NavLayerCurrent = (int)pIVar4->NavLayerCurrent;
  (window->WorkRect).Min.y = fVar6;
  (window->WorkRect).Min.x = fVar1;
  (window->WorkRect).Max.x = pIVar4->WorkMaxX;
  (window->DC).ItemWidth = pIVar4->ItemWidth;
  if (pIVar4->IsEnabled == false) {
    uVar5 = -(uint)(table->RowPosY2 <= fVar6);
    (window->DC).CursorPos.y = (float)(~uVar5 & (uint)table->RowPosY2 | (uint)fVar6 & uVar5);
  }
  bVar2 = pIVar4->IsSkipItems;
  window->SkipItems = bVar2;
  pIVar3 = GImGui;
  if (bVar2 == true) {
    (GImGui->LastItemData).ID = 0;
    (pIVar3->LastItemData).StatusFlags = 0;
  }
  if ((table->Flags & 0x100000) == 0) {
    SetWindowClipRectBeforeSetChannel(window,&pIVar4->ClipRect);
    this = table->DrawSplitter;
    draw_list = window->DrawList;
    uVar5 = (uint)pIVar4->DrawChannelCurrent;
  }
  else {
    this = table->DrawSplitter;
    draw_list = window->DrawList;
    uVar5 = 2;
  }
  ImDrawListSplitter::SetCurrentChannel(this,draw_list,uVar5);
  pIVar3 = GImGui;
  if ((GImGui->LogEnabled == true) && (pIVar4->IsSkipItems == false)) {
    LogRenderedText(&(window->DC).CursorPos,"|",(char *)0x0);
    pIVar3->LogLinePosY = 3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::TableBeginCell(ImGuiTable* table, int column_n)
{
    ImGuiTableColumn* column = &table->Columns[column_n];
    ImGuiWindow* window = table->InnerWindow;
    table->CurrentColumn = column_n;

    // Start position is roughly ~~ CellRect.Min + CellPadding + Indent
    float start_x = column->WorkMinX;
    if (column->Flags & ImGuiTableColumnFlags_IndentEnable)
        start_x += table->RowIndentOffsetX; // ~~ += window.DC.Indent.x - table->HostIndentX, except we locked it for the row.

    window->DC.CursorPos.x = start_x;
    window->DC.CursorPos.y = table->RowPosY1 + table->CellPaddingY;
    window->DC.CursorMaxPos.x = window->DC.CursorPos.x;
    window->DC.ColumnsOffset.x = start_x - window->Pos.x - window->DC.Indent.x; // FIXME-WORKRECT
    window->DC.CurrLineTextBaseOffset = table->RowTextBaseline;
    window->DC.NavLayerCurrent = (ImGuiNavLayer)column->NavLayerCurrent;

    window->WorkRect.Min.y = window->DC.CursorPos.y;
    window->WorkRect.Min.x = column->WorkMinX;
    window->WorkRect.Max.x = column->WorkMaxX;
    window->DC.ItemWidth = column->ItemWidth;

    // To allow ImGuiListClipper to function we propagate our row height
    if (!column->IsEnabled)
        window->DC.CursorPos.y = ImMax(window->DC.CursorPos.y, table->RowPosY2);

    window->SkipItems = column->IsSkipItems;
    if (column->IsSkipItems)
    {
        ImGuiContext& g = *GImGui;
        g.LastItemData.ID = 0;
        g.LastItemData.StatusFlags = 0;
    }

    if (table->Flags & ImGuiTableFlags_NoClip)
    {
        // FIXME: if we end up drawing all borders/bg in EndTable, could remove this and just assert that channel hasn't changed.
        table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
        //IM_ASSERT(table->DrawSplitter._Current == TABLE_DRAW_CHANNEL_NOCLIP);
    }
    else
    {
        // FIXME-TABLE: Could avoid this if draw channel is dummy channel?
        SetWindowClipRectBeforeSetChannel(window, column->ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
    }

    // Logging
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled && !column->IsSkipItems)
    {
        LogRenderedText(&window->DC.CursorPos, "|");
        g.LogLinePosY = FLT_MAX;
    }
}